

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

value_type *
phmap::priv::NodeHashMapPolicy<int,int>::
new_element<phmap::priv::Alloc<std::pair<int_const,int>>,std::piecewise_construct_t_const&,std::tuple<int_const&&>,std::tuple<int&&>>
          (Alloc<std::pair<const_int,_int>_> *alloc,piecewise_construct_t *args,
          tuple<const_int_&&> *args_1,tuple<int_&&> *args_2)

{
  int *piVar1;
  pointer ppVar2;
  PairAlloc pair_alloc;
  
  pair_alloc.id_ = alloc->id_;
  ppVar2 = allocator_traits<phmap::priv::Alloc<std::pair<const_int,_int>_>_>::allocate
                     (&pair_alloc,1);
  piVar1 = (args_2->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>.
           _M_head_impl;
  ppVar2->first =
       *(args_1->super__Tuple_impl<0UL,_const_int_&&>).super__Head_base<0UL,_const_int_&&,_false>.
        _M_head_impl;
  ppVar2->second = *piVar1;
  return ppVar2;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }